

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_settings.cpp
# Opt level: O2

shared_ptr<const_TestSettings> parse_settings(int param_1,char **argv)

{
  long *plVar1;
  element_type *peVar2;
  undefined8 uVar3;
  bool bVar4;
  int iVar5;
  logic_error *this;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_0000003c;
  char *i_option;
  long *plVar6;
  shared_ptr<const_TestSettings> sVar7;
  int integer;
  allocator local_c9;
  element_type *local_c8;
  TestSettings local_c0;
  undefined1 local_78 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_c8 = (element_type *)CONCAT44(in_register_0000003c,param_1);
  local_c0.m_rand_seed = 0;
  local_c0.m_exceptions = true;
  local_c0.m_spare_one_cpu = false;
  local_c0.m_test_allocators = true;
  local_c0.m_print_progress = true;
  local_c0.m_queue_tests_cardinality = 2000;
  local_c0.m_allocator_stress_test = true;
  local_c0.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  integer = 0;
  local_c0.m_run_only.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_exclude.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((*in_RDX != 0) && (i_option = (char *)in_RDX[1], i_option != (char *)0x0)) {
    plVar6 = in_RDX + 1;
    while (i_option != (char *)0x0) {
      bVar4 = anon_unknown.dwarf_125001b::append_string_list(i_option,"-only:",&local_c0.m_run_only)
      ;
      if (!bVar4) {
        bVar4 = anon_unknown.dwarf_125001b::append_string_list
                          ((char *)*plVar6,"-exclude:",&local_c0.m_exclude);
        if (!bVar4) {
          iVar5 = __isoc99_sscanf(*plVar6,"-rand_seed:%u",&local_c0);
          if (iVar5 != 1) {
            iVar5 = __isoc99_sscanf(*plVar6,"-exceptions:%d",&integer);
            if (iVar5 == 1) {
              local_c0.m_exceptions = integer != 0;
            }
            else {
              iVar5 = __isoc99_sscanf(*plVar6,"-spare_one_cpu:%d",&integer);
              if (iVar5 == 1) {
                local_c0.m_spare_one_cpu = integer != 0;
              }
              else {
                iVar5 = __isoc99_sscanf(*plVar6,"-print_progress:%d",&integer);
                if (iVar5 == 1) {
                  local_c0.m_print_progress = integer != 0;
                }
                else {
                  iVar5 = __isoc99_sscanf(*plVar6,"-test_allocators:%d",&integer);
                  if (iVar5 == 1) {
                    local_c0.m_test_allocators = integer != 0;
                  }
                  else {
                    iVar5 = __isoc99_sscanf(*plVar6,"-queue_tests_cardinality:%zu",
                                            &local_c0.m_queue_tests_cardinality);
                    if (iVar5 != 1) {
                      this = (logic_error *)__cxa_allocate_exception(0x10);
                      std::__cxx11::string::string
                                ((string *)(local_78 + 0x28),"Unrecognized commandline: ",&local_c9)
                      ;
                      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_78,
                                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(local_78 + 0x28),(char *)*plVar6);
                      std::logic_error::logic_error(this,(string *)local_78);
                      __cxa_throw(this,&std::logic_error::typeinfo,std::logic_error::~logic_error);
                    }
                  }
                }
              }
            }
          }
        }
      }
      plVar1 = plVar6 + 1;
      plVar6 = plVar6 + 1;
      i_option = (char *)*plVar1;
    }
  }
  std::make_shared<TestSettings,TestSettings&>((TestSettings *)local_78);
  uVar3 = local_78._8_8_;
  peVar2 = local_c8;
  local_78._8_8_ = 0;
  local_c8->m_rand_seed = local_78._0_4_;
  local_c8->m_exceptions = (bool)local_78[4];
  local_c8->m_spare_one_cpu = (bool)local_78[5];
  local_c8->m_test_allocators = (bool)local_78[6];
  local_c8->m_print_progress = (bool)local_78[7];
  local_c8->m_queue_tests_cardinality = uVar3;
  local_78._0_8_ = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
  TestSettings::~TestSettings(&local_c0);
  sVar7.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar7.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar2;
  return (shared_ptr<const_TestSettings>)
         sVar7.super___shared_ptr<const_TestSettings,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const TestSettings> parse_settings(int /*argc*/, char ** argv)
{
    TestSettings results;

    int integer = 0;

    if (*argv != nullptr && *++argv != nullptr)
    {
        for (auto parameter = argv; *parameter != nullptr; parameter++)
        {
            if (append_string_list(*parameter, "-only:", results.m_run_only))
            {
            }
            else if (append_string_list(*parameter, "-exclude:", results.m_exclude))
            {
            }
            else if (sscanf(*parameter, "-rand_seed:%" SCNu32, &results.m_rand_seed) == 1)
            {
            }
            else if (sscanf(*parameter, "-exceptions:%d", &integer) == 1)
            {
                results.m_exceptions = integer != 0;
            }
            else if (sscanf(*parameter, "-spare_one_cpu:%d", &integer) == 1)
            {
                results.m_spare_one_cpu = integer != 0;
            }
            else if (sscanf(*parameter, "-print_progress:%d", &integer) == 1)
            {
                results.m_print_progress = integer != 0;
            }
            else if (sscanf(*parameter, "-test_allocators:%d", &integer) == 1)
            {
                results.m_test_allocators = integer != 0;
            }
            else if (
              sscanf(
                *parameter, "-queue_tests_cardinality:%zu", &results.m_queue_tests_cardinality) ==
              1)
            {
            }
            else
            {
                throw std::logic_error(std::string("Unrecognized commandline: ") + *parameter);
            }
        }
    }
    return std::make_shared<TestSettings>(results);
}